

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  size_t k;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vbool<4> vVar10;
  uint uVar11;
  int iVar12;
  undefined4 uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  ulong uVar19;
  NodeRef *pNVar20;
  bool bVar21;
  vint4 ai_2;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar38;
  float fVar39;
  vint4 bi_3;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai_1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  uint uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  undefined1 auVar70 [64];
  undefined1 auVar74 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [8];
  float fStack_18e0;
  float fStack_18dc;
  undefined1 local_18d8 [8];
  float fStack_18d0;
  float fStack_18cc;
  undefined1 local_18c8 [8];
  float fStack_18c0;
  float fStack_18bc;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar6 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar37 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar41 = vpcmpeqd_avx(auVar37,(undefined1  [16])valid_i->field_0);
    auVar24 = ZEXT816(0) << 0x40;
    auVar29 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar24,5);
    auVar28 = auVar41 & auVar29;
    if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0')
    {
      auVar29 = vandps_avx(auVar29,auVar41);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx(auVar74,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      auVar41 = vcmpps_avx(auVar41,auVar62,1);
      auVar28 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar62,auVar41);
      auVar41 = vandps_avx(auVar74,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar41 = vcmpps_avx(auVar41,auVar62,1);
      auVar45 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar62,auVar41);
      auVar41 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar74);
      auVar41 = vcmpps_avx(auVar41,auVar62,1);
      auVar41 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar62,auVar41);
      auVar49 = vrcpps_avx(auVar28);
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = &DAT_3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar28 = vfnmadd213ps_fma(auVar28,auVar49,auVar63);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar28,auVar49,auVar49)
      ;
      auVar28 = vrcpps_avx(auVar45);
      auVar45 = vfnmadd213ps_fma(auVar45,auVar28,auVar63);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar45,auVar28,auVar28)
      ;
      auVar28 = vrcpps_avx(auVar41);
      auVar41 = vfnmadd213ps_fma(auVar41,auVar28,auVar63);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar28,auVar28)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar24,1);
      auVar28._8_4_ = 0x10;
      auVar28._0_8_ = 0x1000000010;
      auVar28._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar41,auVar28);
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar24,5);
      auVar45._8_4_ = 0x20;
      auVar45._0_8_ = 0x2000000020;
      auVar45._12_4_ = 0x20;
      auVar49._8_4_ = 0x30;
      auVar49._0_8_ = 0x3000000030;
      auVar49._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar49,auVar45,auVar41);
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar24,5);
      auVar50._8_4_ = 0x40;
      auVar50._0_8_ = 0x4000000040;
      auVar50._12_4_ = 0x40;
      auVar54._8_4_ = 0x50;
      auVar54._0_8_ = 0x5000000050;
      auVar54._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar54,auVar50,auVar41);
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar24);
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar24);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar66 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar41,auVar29);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar41,auVar28,auVar29);
      terminated.field_0.i[1] = auVar29._4_4_ ^ auVar37._4_4_;
      terminated.field_0.i[0] = auVar29._0_4_ ^ auVar37._0_4_;
      terminated.field_0.i[2] = auVar29._8_4_ ^ auVar37._8_4_;
      terminated.field_0.i[3] = auVar29._12_4_ ^ auVar37._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar17 = 3;
      }
      else {
        uVar17 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar18 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar37 = vpcmpeqd_avx(auVar29,auVar29);
      auVar70 = ZEXT1664(auVar37);
LAB_00536fca:
      paVar18 = paVar18 + -1;
      root.ptr = pNVar20[-1].ptr;
      pNVar20 = pNVar20 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00537824;
      aVar75 = *paVar18;
      auVar37 = vcmpps_avx((undefined1  [16])aVar75,(undefined1  [16])tray.tfar.field_0,1);
      uVar11 = vmovmskps_avx(auVar37);
      if (uVar11 == 0) {
LAB_00537835:
        iVar12 = 2;
      }
      else {
        uVar19 = (ulong)(uVar11 & 0xff);
        uVar11 = POPCOUNT(uVar11 & 0xff);
        iVar12 = 0;
        if (uVar11 <= uVar17) {
          do {
            k = 0;
            for (uVar14 = uVar19; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar70 = ZEXT1664(auVar70._0_16_);
            bVar21 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar21) {
              terminated.field_0.i[k] = -1;
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
          auVar37 = vpcmpeqd_avx(auVar70._0_16_,auVar70._0_16_);
          auVar70 = ZEXT1664(auVar37);
          auVar37 = auVar37 & ~(undefined1  [16])terminated.field_0;
          iVar12 = 3;
          auVar66 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            auVar37._8_4_ = 0xff800000;
            auVar37._0_8_ = 0xff800000ff800000;
            auVar37._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar37,
                               (undefined1  [16])terminated.field_0);
            iVar12 = 2;
          }
        }
        vVar10.field_0 = terminated.field_0;
        if (uVar17 < uVar11) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00537824;
              auVar37 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar75,6);
              if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar37[0xf]) goto LAB_00537835;
              uVar19 = (ulong)((uint)root.ptr & 0xf);
              if (uVar19 == 8) goto LAB_005377ee;
              lVar16 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar14 = 0;
              auVar37 = auVar70._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_005371f8;
            }
            auVar77 = ZEXT1664(auVar66._0_16_);
            uVar19 = 0;
            uVar14 = 8;
            do {
              uVar15 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar19 * 8);
              if (uVar15 != 8) {
                uVar13 = *(undefined4 *)(root.ptr + 0x20 + uVar19 * 4);
                auVar27._4_4_ = uVar13;
                auVar27._0_4_ = uVar13;
                auVar27._8_4_ = uVar13;
                auVar27._12_4_ = uVar13;
                auVar7._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar7._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar7._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar7._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar28 = vfmsub213ps_fma(auVar27,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar7);
                uVar13 = *(undefined4 *)(root.ptr + 0x40 + uVar19 * 4);
                auVar51._4_4_ = uVar13;
                auVar51._0_4_ = uVar13;
                auVar51._8_4_ = uVar13;
                auVar51._12_4_ = uVar13;
                auVar8._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar8._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar8._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar8._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar24 = vfmsub213ps_fma(auVar51,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar8);
                uVar13 = *(undefined4 *)(root.ptr + 0x60 + uVar19 * 4);
                auVar56._4_4_ = uVar13;
                auVar56._0_4_ = uVar13;
                auVar56._8_4_ = uVar13;
                auVar56._12_4_ = uVar13;
                auVar9._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar9._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar9._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar9._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar45 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar9);
                uVar13 = *(undefined4 *)(root.ptr + 0x30 + uVar19 * 4);
                auVar60._4_4_ = uVar13;
                auVar60._0_4_ = uVar13;
                auVar60._8_4_ = uVar13;
                auVar60._12_4_ = uVar13;
                auVar49 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar7);
                uVar13 = *(undefined4 *)(root.ptr + 0x50 + uVar19 * 4);
                auVar46._4_4_ = uVar13;
                auVar46._0_4_ = uVar13;
                auVar46._8_4_ = uVar13;
                auVar46._12_4_ = uVar13;
                auVar50 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar8);
                uVar13 = *(undefined4 *)(root.ptr + 0x70 + uVar19 * 4);
                auVar31._4_4_ = uVar13;
                auVar31._0_4_ = uVar13;
                auVar31._8_4_ = uVar13;
                auVar31._12_4_ = uVar13;
                auVar54 = vfmsub213ps_fma(auVar31,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar9);
                auVar37 = vpminsd_avx(auVar28,auVar49);
                auVar41 = vpminsd_avx(auVar24,auVar50);
                auVar37 = vpmaxsd_avx(auVar37,auVar41);
                auVar41 = vpminsd_avx(auVar45,auVar54);
                auVar41 = vpmaxsd_avx(auVar37,auVar41);
                auVar37 = vpmaxsd_avx(auVar28,auVar49);
                auVar28 = vpmaxsd_avx(auVar24,auVar50);
                auVar28 = vpminsd_avx(auVar37,auVar28);
                auVar37 = vpmaxsd_avx(auVar45,auVar54);
                auVar28 = vpminsd_avx(auVar28,auVar37);
                auVar37 = vpmaxsd_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
                auVar28 = vpminsd_avx(auVar28,(undefined1  [16])tray.tfar.field_0);
                auVar37 = vcmpps_avx(auVar37,auVar28,2);
                if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar37[0xf] < '\0') {
                  auVar37 = vblendvps_avx(auVar66._0_16_,auVar41,auVar37);
                  if (uVar14 != 8) {
                    pNVar20->ptr = uVar14;
                    pNVar20 = pNVar20 + 1;
                    *paVar18 = auVar77._0_16_;
                    paVar18 = paVar18 + 1;
                  }
                  auVar77 = ZEXT1664(auVar37);
                  uVar14 = uVar15;
                }
              }
              aVar75 = auVar77._0_16_;
            } while ((uVar15 != 8) && (bVar21 = uVar19 < 3, uVar19 = uVar19 + 1, bVar21));
            iVar12 = 0;
            if (uVar14 == 8) {
LAB_0053719e:
              bVar21 = false;
              iVar12 = 4;
            }
            else {
              auVar37 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar75,6);
              uVar13 = vmovmskps_avx(auVar37);
              bVar21 = true;
              if ((uint)POPCOUNT(uVar13) <= uVar17) {
                pNVar20->ptr = uVar14;
                pNVar20 = pNVar20 + 1;
                *paVar18 = aVar75;
                paVar18 = paVar18 + 1;
                goto LAB_0053719e;
              }
            }
            root.ptr = uVar14;
          } while (bVar21);
        }
      }
      goto LAB_00537827;
    }
  }
  return;
  while( true ) {
    uVar14 = uVar14 + 1;
    lVar16 = lVar16 + 0xb0;
    auVar37 = auVar28;
    if (uVar19 - 8 <= uVar14) break;
LAB_005371f8:
    uVar15 = 0;
    auVar41 = auVar37;
    while( true ) {
      uVar11 = *(uint *)(lVar16 + -0x10 + uVar15 * 4);
      if ((ulong)uVar11 == 0xffffffff) break;
      uVar13 = *(undefined4 *)(lVar16 + -0xa0 + uVar15 * 4);
      auVar42._4_4_ = uVar13;
      auVar42._0_4_ = uVar13;
      auVar42._8_4_ = uVar13;
      auVar42._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x90 + uVar15 * 4);
      auVar52._4_4_ = uVar13;
      auVar52._0_4_ = uVar13;
      auVar52._8_4_ = uVar13;
      auVar52._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x80 + uVar15 * 4);
      auVar57._4_4_ = uVar13;
      auVar57._0_4_ = uVar13;
      auVar57._8_4_ = uVar13;
      auVar57._12_4_ = uVar13;
      fVar30 = *(float *)(lVar16 + -0x70 + uVar15 * 4);
      auVar32._4_4_ = fVar30;
      auVar32._0_4_ = fVar30;
      auVar32._8_4_ = fVar30;
      auVar32._12_4_ = fVar30;
      fVar38 = *(float *)(lVar16 + -0x60 + uVar15 * 4);
      auVar61._4_4_ = fVar38;
      auVar61._0_4_ = fVar38;
      auVar61._8_4_ = fVar38;
      auVar61._12_4_ = fVar38;
      fVar39 = *(float *)(lVar16 + -0x50 + uVar15 * 4);
      auVar59._4_4_ = fVar39;
      auVar59._0_4_ = fVar39;
      auVar59._8_4_ = fVar39;
      auVar59._12_4_ = fVar39;
      fVar40 = *(float *)(lVar16 + -0x40 + uVar15 * 4);
      auVar64._4_4_ = fVar40;
      auVar64._0_4_ = fVar40;
      auVar64._8_4_ = fVar40;
      auVar64._12_4_ = fVar40;
      fVar2 = *(float *)(lVar16 + -0x30 + uVar15 * 4);
      auVar68._4_4_ = fVar2;
      auVar68._0_4_ = fVar2;
      auVar68._8_4_ = fVar2;
      auVar68._12_4_ = fVar2;
      fVar3 = *(float *)(lVar16 + -0x20 + uVar15 * 4);
      auVar76._4_4_ = fVar3;
      auVar76._0_4_ = fVar3;
      auVar76._8_4_ = fVar3;
      auVar76._12_4_ = fVar3;
      fVar38 = fVar38 * fVar3;
      auVar47._4_4_ = fVar38;
      auVar47._0_4_ = fVar38;
      auVar47._8_4_ = fVar38;
      auVar47._12_4_ = fVar38;
      auVar47 = vfmsub231ps_fma(auVar47,auVar68,auVar59);
      fVar40 = fVar39 * fVar40;
      auVar55._4_4_ = fVar40;
      auVar55._0_4_ = fVar40;
      auVar55._8_4_ = fVar40;
      auVar55._12_4_ = fVar40;
      auVar55 = vfmsub231ps_fma(auVar55,auVar76,auVar32);
      fVar2 = fVar2 * fVar30;
      auVar33._4_4_ = fVar2;
      auVar33._0_4_ = fVar2;
      auVar33._8_4_ = fVar2;
      auVar33._12_4_ = fVar2;
      auVar49 = vsubps_avx(auVar42,*(undefined1 (*) [16])ray);
      auVar50 = vsubps_avx(auVar52,*(undefined1 (*) [16])(ray + 0x10));
      auVar33 = vfmsub231ps_fma(auVar33,auVar64,auVar61);
      auVar54 = vsubps_avx(auVar57,*(undefined1 (*) [16])(ray + 0x20));
      auVar28 = *(undefined1 (*) [16])(ray + 0x40);
      auVar24 = *(undefined1 (*) [16])(ray + 0x50);
      auVar45 = *(undefined1 (*) [16])(ray + 0x60);
      auVar78._0_4_ = auVar28._0_4_ * auVar50._0_4_;
      auVar78._4_4_ = auVar28._4_4_ * auVar50._4_4_;
      auVar78._8_4_ = auVar28._8_4_ * auVar50._8_4_;
      auVar78._12_4_ = auVar28._12_4_ * auVar50._12_4_;
      auVar42 = vfmsub231ps_fma(auVar78,auVar49,auVar24);
      auVar58._0_4_ = auVar45._0_4_ * auVar33._0_4_;
      auVar58._4_4_ = auVar45._4_4_ * auVar33._4_4_;
      auVar58._8_4_ = auVar45._8_4_ * auVar33._8_4_;
      auVar58._12_4_ = auVar45._12_4_ * auVar33._12_4_;
      auVar62 = vfmadd231ps_fma(auVar58,auVar55,auVar24);
      auVar79._0_4_ = auVar24._0_4_ * auVar54._0_4_;
      auVar79._4_4_ = auVar24._4_4_ * auVar54._4_4_;
      auVar79._8_4_ = auVar24._8_4_ * auVar54._8_4_;
      auVar79._12_4_ = auVar24._12_4_ * auVar54._12_4_;
      auVar52 = vfmsub231ps_fma(auVar79,auVar50,auVar45);
      auVar80._0_4_ = auVar45._0_4_ * auVar49._0_4_;
      auVar80._4_4_ = auVar45._4_4_ * auVar49._4_4_;
      auVar80._8_4_ = auVar45._8_4_ * auVar49._8_4_;
      auVar80._12_4_ = auVar45._12_4_ * auVar49._12_4_;
      auVar57 = vfmsub231ps_fma(auVar80,auVar54,auVar28);
      auVar63 = vfmadd231ps_fma(auVar62,auVar47,auVar28);
      auVar24._0_4_ = fVar3 * auVar42._0_4_;
      auVar24._4_4_ = fVar3 * auVar42._4_4_;
      auVar24._8_4_ = fVar3 * auVar42._8_4_;
      auVar24._12_4_ = fVar3 * auVar42._12_4_;
      auVar24 = vfmadd231ps_fma(auVar24,auVar57,auVar68);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar28 = vandps_avx(auVar69,auVar63);
      auVar24 = vfmadd231ps_fma(auVar24,auVar52,auVar64);
      uVar67 = auVar28._0_4_;
      auVar65._0_4_ = uVar67 ^ auVar24._0_4_;
      uVar71 = auVar28._4_4_;
      auVar65._4_4_ = uVar71 ^ auVar24._4_4_;
      uVar72 = auVar28._8_4_;
      auVar65._8_4_ = uVar72 ^ auVar24._8_4_;
      uVar73 = auVar28._12_4_;
      auVar65._12_4_ = uVar73 ^ auVar24._12_4_;
      auVar45 = vcmpps_avx(auVar65,_DAT_01feba10,5);
      auVar62 = auVar41 & auVar45;
      auVar24 = auVar6;
      if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar62[0xf])
      {
LAB_00537324:
        auVar28 = vpcmpeqd_avx(auVar28,auVar28);
      }
      else {
        auVar45 = vandps_avx(auVar45,auVar41);
        auVar23._0_4_ = fVar39 * auVar42._0_4_;
        auVar23._4_4_ = fVar39 * auVar42._4_4_;
        auVar23._8_4_ = fVar39 * auVar42._8_4_;
        auVar23._12_4_ = fVar39 * auVar42._12_4_;
        auVar62 = vfmadd132ps_fma(auVar57,auVar23,auVar61);
        auVar62 = vfmadd132ps_fma(auVar52,auVar62,auVar32);
        auVar48._0_4_ = uVar67 ^ auVar62._0_4_;
        auVar48._4_4_ = uVar71 ^ auVar62._4_4_;
        auVar48._8_4_ = uVar72 ^ auVar62._8_4_;
        auVar48._12_4_ = uVar73 ^ auVar62._12_4_;
        auVar62 = vcmpps_avx(auVar48,_DAT_01feba10,5);
        auVar42 = auVar45 & auVar62;
        local_1968 = auVar47;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf]
           ) goto LAB_00537324;
        auVar42 = vandps_avx(auVar63,auVar74);
        auVar45 = vandps_avx(auVar62,auVar45);
        auVar62 = vsubps_avx(auVar42,auVar65);
        auVar62 = vcmpps_avx(auVar62,auVar48,5);
        auVar52 = auVar45 & auVar62;
        if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar52[0xf] < '\0') {
          auVar45 = vandps_avx(auVar62,auVar45);
          auVar25._0_4_ = auVar54._0_4_ * auVar33._0_4_;
          auVar25._4_4_ = auVar54._4_4_ * auVar33._4_4_;
          auVar25._8_4_ = auVar54._8_4_ * auVar33._8_4_;
          auVar25._12_4_ = auVar54._12_4_ * auVar33._12_4_;
          auVar50 = vfmadd213ps_fma(auVar50,auVar55,auVar25);
          auVar49 = vfmadd132ps_fma(auVar49,auVar50,auVar47);
          auVar53._0_4_ = uVar67 ^ auVar49._0_4_;
          auVar53._4_4_ = uVar71 ^ auVar49._4_4_;
          auVar53._8_4_ = uVar72 ^ auVar49._8_4_;
          auVar53._12_4_ = uVar73 ^ auVar49._12_4_;
          auVar26._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
          auVar26._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
          auVar26._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
          auVar26._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
          auVar44._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
          auVar44._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
          auVar44._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
          auVar44._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
          auVar49 = vcmpps_avx(auVar26,auVar53,1);
          auVar50 = vcmpps_avx(auVar53,auVar44,2);
          auVar49 = vandps_avx(auVar50,auVar49);
          auVar50 = auVar45 & auVar49;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar45 = vandps_avx(auVar45,auVar49);
            auVar49 = vcmpps_avx(auVar63,_DAT_01feba10,4);
            auVar50 = auVar45 & auVar49;
            if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              auVar24 = vandps_avx(auVar49,auVar45);
              local_1968._0_8_ = auVar47._0_8_;
              local_1908 = local_1968._0_8_;
              local_1968._8_8_ = auVar47._8_8_;
              uStack_1900 = local_1968._8_8_;
              local_1928 = auVar33;
              local_1918 = auVar55;
              local_18f8 = auVar42;
              _local_18e8 = auVar53;
              _local_18d8 = auVar48;
              _local_18c8 = auVar65;
            }
          }
        }
        auVar28 = vpcmpeqd_avx(auVar28,auVar28);
      }
      auVar70 = ZEXT1664(auVar28);
      auVar66 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      pGVar4 = (context->scene->geometries).items[uVar11].ptr;
      uVar67 = pGVar4->mask;
      auVar22._4_4_ = uVar67;
      auVar22._0_4_ = uVar67;
      auVar22._8_4_ = uVar67;
      auVar22._12_4_ = uVar67;
      auVar45 = vpand_avx(auVar22,*(undefined1 (*) [16])(ray + 0x90));
      auVar45 = vpcmpeqd_avx(auVar45,_DAT_01feba10);
      auVar49 = auVar24 & ~auVar45;
      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0'
         ) {
        uVar13 = *(undefined4 *)(lVar16 + uVar15 * 4);
        auVar24 = vandnps_avx(auVar45,auVar24);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar45 = vrcpps_avx(local_18f8);
          auVar43._8_4_ = 0x3f800000;
          auVar43._0_8_ = &DAT_3f8000003f800000;
          auVar43._12_4_ = 0x3f800000;
          auVar49 = vfnmadd213ps_fma(auVar45,local_18f8,auVar43);
          auVar45 = vfmadd132ps_fma(auVar49,auVar45,auVar45);
          fVar30 = auVar45._0_4_;
          local_1738._0_4_ = fVar30 * (float)local_18c8._0_4_;
          fVar38 = auVar45._4_4_;
          local_1738._4_4_ = fVar38 * (float)local_18c8._4_4_;
          fVar39 = auVar45._8_4_;
          local_1738._8_4_ = fVar39 * fStack_18c0;
          fVar40 = auVar45._12_4_;
          local_1738._12_4_ = fVar40 * fStack_18bc;
          local_1728 = fVar30 * (float)local_18d8._0_4_;
          fStack_1724 = fVar38 * (float)local_18d8._4_4_;
          fStack_1720 = fVar39 * fStack_18d0;
          fStack_171c = fVar40 * fStack_18cc;
          local_1718._4_4_ = uVar13;
          local_1718._0_4_ = uVar13;
          local_1718._8_4_ = uVar13;
          local_1718._12_4_ = uVar13;
          local_1768 = local_1908;
          uStack_1760 = uStack_1900;
          local_1758 = local_1918._0_8_;
          uStack_1750 = local_1918._8_8_;
          local_1748 = local_1928;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          auVar34._0_4_ = fVar30 * (float)local_18e8._0_4_;
          auVar34._4_4_ = fVar38 * (float)local_18e8._4_4_;
          auVar34._8_4_ = fVar39 * fStack_18e0;
          auVar34._12_4_ = fVar40 * fStack_18dc;
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar45 = *(undefined1 (*) [16])(ray + 0x80);
          auVar49 = vblendvps_avx(auVar45,auVar34,auVar24);
          *(undefined1 (*) [16])(ray + 0x80) = auVar49;
          args.valid = (int *)local_1978;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1978 = auVar24;
          args.ray = (RTCRayN *)ray;
          local_1708 = uVar11;
          uStack_1704 = uVar11;
          uStack_1700 = uVar11;
          uStack_16fc = uVar11;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar66 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1978 == (undefined1  [16])0x0) {
            auVar24 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar28 = vpcmpeqd_avx(auVar28,auVar28);
            auVar70 = ZEXT1664(auVar28);
            auVar28 = auVar28 ^ auVar24;
          }
          else {
            p_Var5 = context->args->filter;
            auVar28 = vpcmpeqd_avx(auVar28,auVar28);
            auVar70 = ZEXT1664(auVar28);
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar28 = vpcmpeqd_avx(auVar28,auVar28);
              auVar70 = ZEXT1664(auVar28);
              auVar66 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar24 = vpcmpeqd_avx((undefined1  [16])0x0,local_1978);
            auVar28 = auVar70._0_16_ ^ auVar24;
            auVar35._8_4_ = 0xff800000;
            auVar35._0_8_ = 0xff800000ff800000;
            auVar35._12_4_ = 0xff800000;
            auVar24 = vblendvps_avx(auVar35,*(undefined1 (*) [16])(args.ray + 0x80),auVar24);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar24;
          }
          auVar28 = vpslld_avx(auVar28,0x1f);
          auVar24 = vpsrad_avx(auVar28,0x1f);
          auVar28 = vblendvps_avx(auVar45,*(undefined1 (*) [16])pRVar1,auVar28);
          *(undefined1 (*) [16])pRVar1 = auVar28;
        }
        auVar41 = vpandn_avx(auVar24,auVar41);
      }
      if (((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf])
         || (bVar21 = 2 < uVar15, uVar15 = uVar15 + 1, bVar21)) break;
    }
    auVar28 = vpand_avx(auVar41,auVar37);
    auVar37 = auVar37 & auVar41;
    if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar37[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar70._0_16_ ^ auVar28);
LAB_005377ee:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar10.field_0,(undefined1  [16])terminated.field_0);
  auVar37 = auVar70._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar37[0xf]) {
LAB_00537824:
    iVar12 = 3;
  }
  else {
    auVar36._8_4_ = 0xff800000;
    auVar36._0_8_ = 0xff800000ff800000;
    auVar36._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar36,
                       (undefined1  [16])terminated.field_0);
    iVar12 = 0;
  }
LAB_00537827:
  if (iVar12 == 3) {
    auVar6 = vandps_avx(auVar29,(undefined1  [16])terminated.field_0);
    auVar29._8_4_ = 0xff800000;
    auVar29._0_8_ = 0xff800000ff800000;
    auVar29._12_4_ = 0xff800000;
    auVar6 = vmaskmovps_avx(auVar6,auVar29);
    *(undefined1 (*) [16])pRVar1 = auVar6;
    return;
  }
  goto LAB_00536fca;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }